

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Location loc_29;
  Location loc_30;
  Location loc_31;
  Location loc_32;
  Location loc_33;
  Location loc_34;
  Location loc_35;
  Token token_13;
  Token token_14;
  Token token_15;
  Token token_16;
  Token token_17;
  Token token_18;
  Token token_19;
  Token token_20;
  Token token_21;
  Token token_22;
  v128 val;
  undefined8 uVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Opcode OVar5;
  pointer pEVar6;
  SelectExpr *this_00;
  pointer pBVar7;
  reference rhs;
  pointer pCVar8;
  CallRefExpr *this_01;
  pointer pRVar9;
  ConstExpr *this_02;
  TableCopyExpr *this_03;
  TableInitExpr *this_04;
  SimdLaneOpExpr *this_05;
  SimdShuffleOpExpr *this_06;
  uint64_t uStack_18d8;
  Result result_2;
  uint64_t lane_idx_1;
  Location loc_1;
  undefined1 auStack_18a8 [4];
  int lane;
  v128 values;
  Token token_12;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  Token local_17f0;
  char *local_17b0;
  size_t sStack_17a8;
  char *local_17a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_1798;
  Enum local_178c;
  Enum local_1788;
  Enum local_1784;
  char *local_1780;
  size_t local_1778;
  char *local_1770;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1768;
  Enum local_175c;
  uint64_t uStack_1758;
  Result result_1;
  uint64_t lane_idx;
  Token token_11;
  undefined1 local_1708 [8];
  Token token_10;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined1 local_1660 [8];
  Token token_9;
  undefined8 uStack_1618;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined1 local_15b8 [8];
  Token token_8;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined1 local_1510 [8];
  Token token_7;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined1 local_1468 [8];
  Token token_6;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13c0 [8];
  Token token_5;
  undefined1 local_1378 [4];
  uint32_t consistency_model;
  Token token_4;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined1 local_12d0 [8];
  Token token_3;
  Token local_1268;
  char *local_1228;
  size_t local_1220;
  char *local_1218;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1210;
  Enum local_1204;
  Token local_1200;
  Token local_11c0;
  Type local_117c;
  Enum local_1174;
  Type local_1170;
  Type type;
  Token local_1100;
  char *local_10c0;
  size_t local_10b8;
  char *local_10b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_10a8;
  Enum local_109c;
  Token local_1098;
  char *local_1058;
  size_t local_1050;
  char *local_1048;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1040;
  Enum local_1034;
  Token local_1030;
  char *local_ff0;
  size_t local_fe8;
  char *local_fe0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_fd8;
  Enum local_fcc;
  Token local_fc8;
  char *local_f88;
  size_t local_f80;
  char *local_f78;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_f70;
  Enum local_f64;
  Token local_f60;
  char *local_f20;
  size_t local_f18;
  char *local_f10;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_f08;
  Enum local_efc;
  Token local_ef8;
  Var local_eb8;
  undefined1 local_e70 [8];
  Var table_index;
  undefined1 local_e20 [8];
  Var segment_index;
  Token local_d70;
  Var local_d30;
  Var local_ce8;
  undefined1 local_ca0 [8];
  Var src;
  Var dst;
  Token local_ba8;
  char *local_b68;
  size_t local_b60;
  char *local_b58;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_b50;
  Enum local_b44;
  Token local_b40;
  char *local_b00;
  size_t local_af8;
  char *local_af0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_ae8;
  Enum local_adc;
  Token local_ad8;
  char *local_a98;
  size_t local_a90;
  char *local_a88;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a80;
  Enum local_a74;
  Token local_a70;
  char *local_a30;
  size_t local_a28;
  char *local_a20;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a18;
  Enum local_a0c;
  Token local_a08;
  char *local_9c8;
  size_t local_9c0;
  char *local_9b8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_9b0;
  Enum local_9a4;
  Token local_9a0;
  Enum local_95c;
  undefined1 local_958 [8];
  Token token_2;
  undefined1 local_8d0 [8];
  Token token_1;
  undefined1 local_888 [8];
  Token token;
  undefined1 local_840 [8];
  Const const_;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  Token local_788;
  char *local_748;
  size_t sStack_740;
  char *local_738;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_730;
  Enum local_724;
  char *local_720;
  size_t local_718;
  char *local_710;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_708;
  Enum local_6fc;
  Token local_6f8;
  char *local_6b8;
  size_t local_6b0;
  char *local_6a8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_6a0;
  Enum local_694;
  Token local_690;
  char *local_650;
  size_t local_648;
  char *local_640;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_638;
  Enum local_62c;
  Token local_628;
  char *local_5e8;
  size_t local_5e0;
  char *local_5d8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_5d0;
  Enum local_5c4;
  Token local_5c0;
  char *local_580;
  size_t local_578;
  char *local_570;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_568;
  Enum local_55c;
  Token local_558;
  Enum local_518;
  Enum local_514;
  Var local_510;
  undefined1 local_4c8 [8];
  __single_object expr_2;
  Token local_458;
  Token local_418;
  Enum local_3d8;
  Enum local_3d4;
  Var local_3d0;
  undefined1 local_388 [8];
  __single_object expr_1;
  Token local_318;
  Token local_2d8;
  Enum local_294;
  undefined1 local_290 [8];
  __single_object expr;
  Token local_220;
  char *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1c8;
  Enum local_1bc;
  Token local_1b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_178;
  int local_160;
  Enum local_15c;
  undefined1 local_158 [8];
  TypeVector result;
  Token local_100;
  Token local_c0;
  Token local_80;
  undefined1 local_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)local_40,this);
  TVar3 = Peek(this,0);
  uVar1 = loc.field_1._8_8_;
  switch(TVar3) {
  case AtomicFence:
    Consume((Token *)local_1378,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1378);
    uVar1 = loc.field_1._8_8_;
    token_5.field_2._20_4_ = 0;
    pEVar6 = (pointer)operator_new(0x40);
    AtomicFenceExpr::AtomicFenceExpr
              ((AtomicFenceExpr *)pEVar6,token_5.field_2._20_4_,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case AtomicLoad:
    Consume((Token *)local_1468,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1468);
    memcpy((void *)((long)&token_7.field_2 + 0x10),local_1468,0x40);
    loc_28.filename._M_str = (char *)loc.filename._M_len;
    loc_28.filename._M_len = (size_t)local_40;
    loc_28.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_28.field_1._8_8_ = loc.field_1.field_1.offset;
    token_17.loc.filename._M_str = (char *)uStack_14c8;
    token_17.loc.filename._M_len = (size_t)token_7.field_2.literal_.text._M_str;
    token_17.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_14c0;
    token_17.loc.field_1._8_8_ = uStack_14b8;
    token_17._32_8_ = local_14b0;
    token_17.field_2.text_._M_len = uStack_14a8;
    token_17.field_2.text_._M_str = (char *)local_14a0;
    token_17.field_2.literal_.text._M_str = (char *)uStack_1498;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_28,token_17,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicNotify:
    Consume((Token *)local_12d0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_12d0);
    memcpy((void *)((long)&token_4.field_2 + 0x10),local_12d0,0x40);
    loc_26.filename._M_str = (char *)loc.filename._M_len;
    loc_26.filename._M_len = (size_t)local_40;
    loc_26.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_26.field_1._8_8_ = loc.field_1.field_1.offset;
    token_15.loc.filename._M_str = (char *)uStack_1330;
    token_15.loc.filename._M_len = (size_t)token_4.field_2.literal_.text._M_str;
    token_15.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1328;
    token_15.loc.field_1._8_8_ = uStack_1320;
    token_15._32_8_ = local_1318;
    token_15.field_2.text_._M_len = uStack_1310;
    token_15.field_2.text_._M_str = (char *)local_1308;
    token_15.field_2.literal_.text._M_str = (char *)uStack_1300;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_26,token_15,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmw:
    Consume((Token *)local_15b8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_15b8);
    memcpy((void *)((long)&token_9.field_2 + 0x10),local_15b8,0x40);
    loc_30.filename._M_str = (char *)loc.filename._M_len;
    loc_30.filename._M_len = (size_t)local_40;
    loc_30.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_30.field_1._8_8_ = loc.field_1.field_1.offset;
    token_19.loc.filename._M_str = (char *)uStack_1618;
    token_19.loc.filename._M_len = (size_t)token_9.field_2.literal_.text._M_str;
    token_19.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1610;
    token_19.loc.field_1._8_8_ = uStack_1608;
    token_19._32_8_ = local_1600;
    token_19.field_2.text_._M_len = uStack_15f8;
    token_19.field_2.text_._M_str = (char *)local_15f0;
    token_19.field_2.literal_.text._M_str = (char *)uStack_15e8;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_30,token_19,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmwCmpxchg:
    Consume((Token *)local_1660,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1660);
    memcpy((void *)((long)&token_10.field_2 + 0x10),local_1660,0x40);
    loc_31.filename._M_str = (char *)loc.filename._M_len;
    loc_31.filename._M_len = (size_t)local_40;
    loc_31.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_31.field_1._8_8_ = loc.field_1.field_1.offset;
    token_20.loc.filename._M_str = (char *)uStack_16c0;
    token_20.loc.filename._M_len = (size_t)token_10.field_2.literal_.text._M_str;
    token_20.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_16b8;
    token_20.loc.field_1._8_8_ = uStack_16b0;
    token_20._32_8_ = local_16a8;
    token_20.field_2.text_._M_len = uStack_16a0;
    token_20.field_2.text_._M_str = (char *)local_1698;
    token_20.field_2.literal_.text._M_str = (char *)uStack_1690;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_31,token_20,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicStore:
    Consume((Token *)local_1510,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1510);
    memcpy((void *)((long)&token_8.field_2 + 0x10),local_1510,0x40);
    loc_29.filename._M_str = (char *)loc.filename._M_len;
    loc_29.filename._M_len = (size_t)local_40;
    loc_29.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_29.field_1._8_8_ = loc.field_1.field_1.offset;
    token_18.loc.filename._M_str = (char *)uStack_1570;
    token_18.loc.filename._M_len = (size_t)token_8.field_2.literal_.text._M_str;
    token_18.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1568;
    token_18.loc.field_1._8_8_ = uStack_1560;
    token_18._32_8_ = local_1558;
    token_18.field_2.text_._M_len = uStack_1550;
    token_18.field_2.text_._M_str = (char *)local_1548;
    token_18.field_2.literal_.text._M_str = (char *)uStack_1540;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_29,token_18,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicWait:
    Consume((Token *)local_13c0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_13c0);
    memcpy((void *)((long)&token_6.field_2 + 0x10),local_13c0,0x40);
    loc_27.filename._M_str = (char *)loc.filename._M_len;
    loc_27.filename._M_len = (size_t)local_40;
    loc_27.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_27.field_1._8_8_ = loc.field_1.field_1.offset;
    token_16.loc.filename._M_str = (char *)uStack_1420;
    token_16.loc.filename._M_len = (size_t)token_6.field_2.literal_.text._M_str;
    token_16.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1418;
    token_16.loc.field_1._8_8_ = uStack_1410;
    token_16._32_8_ = local_1408;
    token_16.field_2.text_._M_len = uStack_1400;
    token_16.field_2.text_._M_str = (char *)local_13f8;
    token_16.field_2.literal_.text._M_str = (char *)uStack_13f0;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)6>>
                      (this,loc_27,token_16,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Binary:
    Consume((Token *)local_8d0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_8d0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    OVar5 = Token::opcode((Token *)local_8d0);
    OpcodeExpr<(wabt::ExprType)7>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)7> *)pEVar6,OVar5,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0x9bb,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_1b8,this);
    local_1e0 = (char *)local_40;
    local_1d8 = loc.filename._M_len;
    local_1d0 = loc.filename._M_str;
    local_1c8.offset = (size_t)loc.field_1.field_1.offset;
    loc_00.filename._M_str = (char *)loc.filename._M_len;
    loc_00.filename._M_len = (size_t)local_40;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_00.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1bc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>
                                (this,loc_00,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_1bc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrIf:
    Consume(&local_220,this);
    loc_01.filename._M_str = (char *)loc.filename._M_len;
    loc_01.filename._M_len = (size_t)local_40;
    loc_01.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_01.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)10>>
                      (this,loc_01,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrTable:
    Consume((Token *)&expr,this);
    std::make_unique<wabt::BrTableExpr,wabt::Location&>((Location *)local_290);
    pBVar7 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                       ((unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)
                        local_290);
    local_294 = (Enum)ParseVarList(this,&pBVar7->targets);
    bVar2 = Failed((Result)local_294);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pBVar7 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->((unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)
                          local_290);
      rhs = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::back(&pBVar7->targets);
      pBVar7 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->((unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)
                          local_290);
      Var::operator=(&pBVar7->default_target,rhs);
      pBVar7 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->((unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)
                          local_290);
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back(&pBVar7->targets);
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                 (unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)local_290
                );
      local_160 = 2;
    }
    std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::~unique_ptr
              ((unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> *)local_290);
    goto joined_r0x0018d427;
  case Call:
    Consume(&local_318,this);
    loc_02.filename._M_str = (char *)loc.filename._M_len;
    loc_02.filename._M_len = (size_t)local_40;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_02.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>
                      (this,loc_02,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallIndirect:
    Consume((Token *)&expr_1,this);
    std::make_unique<wabt::CallIndirectExpr,wabt::Location&>((Location *)local_388);
    pCVar8 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->((unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                         *)local_388);
    Var::Var(&local_3d0,0,(Location *)local_40);
    ParseVarOpt(this,&pCVar8->table,&local_3d0);
    Var::~Var(&local_3d0);
    pCVar8 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->((unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                         *)local_388);
    local_3d4 = (Enum)ParseTypeUseOpt(this,&pCVar8->decl);
    bVar2 = Failed((Result)local_3d4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pCVar8 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
               ::operator->((unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                             *)local_388);
      local_3d8 = (Enum)ParseUnboundFuncSignature(this,&(pCVar8->decl).sig);
      bVar2 = Failed((Result)local_3d8);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   (unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                    *)local_388);
        local_160 = 2;
      }
    }
    std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
    ~unique_ptr((unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> *)
                local_388);
    goto joined_r0x0018d427;
  case CallRef:
    Consume(&local_418,this);
    ErrorUnlessOpcodeEnabled(this,&local_418);
    uVar1 = loc.field_1._8_8_;
    this_01 = (CallRefExpr *)operator_new(0x88);
    CallRefExpr::CallRefExpr(this_01,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_01);
    break;
  case Compare:
    pEVar6 = (pointer)operator_new(0x40);
    Consume((Token *)&token_2.field_2.literal_.text._M_str,this);
    OVar5 = Token::opcode((Token *)&token_2.field_2.literal_.text._M_str);
    OpcodeExpr<(wabt::ExprType)16>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)16> *)pEVar6,OVar5,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Const:
    Const::Const((Const *)local_840);
    token.field_2._20_4_ = ParseConst(this,(Const *)local_840,Normal);
    bVar2 = Failed((Result)token.field_2._20_4_);
    uVar1 = loc.field_1._8_8_;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    this_02 = (ConstExpr *)operator_new(0x90);
    ConstExpr::ConstExpr(this_02,(Const *)local_840,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_02);
    break;
  case Convert:
    Consume((Token *)local_958,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_958);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    local_95c = (Enum)Token::opcode((Token *)local_958);
    OpcodeExpr<(wabt::ExprType)18>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)18> *)pEVar6,(Opcode)local_95c,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case DataDrop:
    Consume(&local_a70,this);
    ErrorUnlessOpcodeEnabled(this,&local_a70);
    local_a98 = (char *)local_40;
    local_a90 = loc.filename._M_len;
    local_a88 = loc.filename._M_str;
    local_a80.offset = (size_t)loc.field_1.field_1.offset;
    loc_13.filename._M_str = (char *)loc.filename._M_len;
    loc_13.filename._M_len = (size_t)local_40;
    loc_13.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_13.field_1._8_8_ = loc.field_1.field_1.offset;
    local_a74 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)29>>
                                (this,loc_13,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_a74);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Drop:
    Consume(&local_100,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)19>::ExprMixin
              ((ExprMixin<(wabt::ExprType)19> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case ElemDrop:
    Consume(&local_d70,this);
    ErrorUnlessOpcodeEnabled(this,&local_d70);
    loc_17.filename._M_str = (char *)loc.filename._M_len;
    loc_17.filename._M_len = (size_t)local_40;
    loc_17.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_17.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>
                      (this,loc_17,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalGet:
    Consume(&local_690,this);
    local_6b8 = (char *)local_40;
    local_6b0 = loc.filename._M_len;
    local_6a8 = loc.filename._M_str;
    local_6a0.offset = (size_t)loc.field_1.field_1.offset;
    loc_07.filename._M_str = (char *)loc.filename._M_len;
    loc_07.filename._M_len = (size_t)local_40;
    loc_07.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_07.field_1._8_8_ = loc.field_1.field_1.offset;
    local_694 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)20>>
                                (this,loc_07,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_694);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalSet:
    Consume(&local_6f8,this);
    local_720 = (char *)local_40;
    local_718 = loc.filename._M_len;
    local_710 = loc.filename._M_str;
    local_708.offset = (size_t)loc.field_1.field_1.offset;
    loc_08.filename._M_str = (char *)loc.filename._M_len;
    loc_08.filename._M_len = (size_t)local_40;
    loc_08.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_08.field_1._8_8_ = loc.field_1.field_1.offset;
    local_6fc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)21>>
                                (this,loc_08,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_6fc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Load:
    local_748 = (char *)local_40;
    sStack_740 = loc.filename._M_len;
    local_738 = loc.filename._M_str;
    aStack_730.offset = (size_t)loc.field_1.field_1.offset;
    Consume(&local_788,this);
    loc_09.filename._M_str = (char *)sStack_740;
    loc_09.filename._M_len = (size_t)local_748;
    loc_09.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_738;
    loc_09.field_1._8_8_ = aStack_730.offset;
    token_13.loc.filename._M_str = local_788.loc.filename._M_str;
    token_13.loc.filename._M_len = local_788.loc.filename._M_len;
    token_13.loc.field_1.field_1.offset = local_788.loc.field_1.field_1.offset;
    token_13.loc.field_1._8_8_ = local_788.loc.field_1._8_8_;
    token_13.token_type_ = local_788.token_type_;
    token_13._36_4_ = local_788._36_4_;
    token_13.field_2.text_._M_len = local_788.field_2.text_._M_len;
    token_13.field_2.text_._M_str = local_788.field_2.text_._M_str;
    token_13.field_2.literal_.text._M_str = local_788.field_2.literal_.text._M_str;
    local_724 = (Enum)ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)23>>
                                (this,loc_09,token_13,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_724);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalGet:
    Consume(&local_558,this);
    local_580 = (char *)local_40;
    local_578 = loc.filename._M_len;
    local_570 = loc.filename._M_str;
    local_568.offset = (size_t)loc.field_1.field_1.offset;
    loc_04.filename._M_str = (char *)loc.filename._M_len;
    loc_04.filename._M_len = (size_t)local_40;
    loc_04.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_04.field_1._8_8_ = loc.field_1.field_1.offset;
    local_55c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>
                                (this,loc_04,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_55c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalSet:
    Consume(&local_5c0,this);
    local_5e8 = (char *)local_40;
    local_5e0 = loc.filename._M_len;
    local_5d8 = loc.filename._M_str;
    local_5d0.offset = (size_t)loc.field_1.field_1.offset;
    loc_05.filename._M_str = (char *)loc.filename._M_len;
    loc_05.filename._M_len = (size_t)local_40;
    loc_05.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_05.field_1._8_8_ = loc.field_1.field_1.offset;
    local_5c4 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)25>>
                                (this,loc_05,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_5c4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalTee:
    Consume(&local_628,this);
    local_650 = (char *)local_40;
    local_648 = loc.filename._M_len;
    local_640 = loc.filename._M_str;
    local_638.offset = (size_t)loc.field_1.field_1.offset;
    loc_06.filename._M_str = (char *)loc.filename._M_len;
    loc_06.filename._M_len = (size_t)local_40;
    loc_06.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_06.field_1._8_8_ = loc.field_1.field_1.offset;
    local_62c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)26>>
                                (this,loc_06,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_62c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryCopy:
    Consume(&local_9a0,this);
    ErrorUnlessOpcodeEnabled(this,&local_9a0);
    local_9c8 = (char *)local_40;
    local_9c0 = loc.filename._M_len;
    local_9b8 = loc.filename._M_str;
    local_9b0.offset = (size_t)loc.field_1.field_1.offset;
    loc_11.filename._M_str = (char *)loc.filename._M_len;
    loc_11.filename._M_len = (size_t)local_40;
    loc_11.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_11.field_1._8_8_ = loc.field_1.field_1.offset;
    local_9a4 = (Enum)ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>
                                (this,loc_11,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_9a4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryFill:
    Consume(&local_a08,this);
    ErrorUnlessOpcodeEnabled(this,&local_a08);
    local_a30 = (char *)local_40;
    local_a28 = loc.filename._M_len;
    local_a20 = loc.filename._M_str;
    local_a18.offset = (size_t)loc.field_1.field_1.offset;
    loc_12.filename._M_str = (char *)loc.filename._M_len;
    loc_12.filename._M_len = (size_t)local_40;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_12.field_1._8_8_ = loc.field_1.field_1.offset;
    local_a0c = (Enum)ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)30>>
                                (this,loc_12,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_a0c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryGrow:
    Consume(&local_ba8,this);
    loc_16.filename._M_str = (char *)loc.filename._M_len;
    loc_16.filename._M_len = (size_t)local_40;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_16.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)31>>
                      (this,loc_16,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryInit:
    Consume(&local_ad8,this);
    ErrorUnlessOpcodeEnabled(this,&local_ad8);
    local_b00 = (char *)local_40;
    local_af8 = loc.filename._M_len;
    local_af0 = loc.filename._M_str;
    local_ae8.offset = (size_t)loc.field_1.field_1.offset;
    loc_14.filename._M_str = (char *)loc.filename._M_len;
    loc_14.filename._M_len = (size_t)local_40;
    loc_14.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_14.field_1._8_8_ = loc.field_1.field_1.offset;
    local_adc = (Enum)ParseMemoryInstrVar<wabt::MemoryVarExpr<(wabt::ExprType)32>>
                                (this,loc_14,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_adc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemorySize:
    Consume(&local_b40,this);
    local_b68 = (char *)local_40;
    local_b60 = loc.filename._M_len;
    local_b58 = loc.filename._M_str;
    local_b50.offset = (size_t)loc.field_1.field_1.offset;
    loc_15.filename._M_str = (char *)loc.filename._M_len;
    loc_15.filename._M_len = (size_t)local_40;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_15.field_1._8_8_ = loc.field_1.field_1.offset;
    local_b44 = (Enum)ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)33>>
                                (this,loc_15,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_b44);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Nop:
    Consume(&local_c0,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)34>::ExprMixin
              ((ExprMixin<(wabt::ExprType)34> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case RefFunc:
    Consume(&local_1100,this);
    ErrorUnlessOpcodeEnabled(this,&local_1100);
    loc_23.filename._M_str = (char *)loc.filename._M_len;
    loc_23.filename._M_len = (size_t)local_40;
    loc_23.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_23.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>
                      (this,loc_23,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefIsNull:
    Consume(&local_11c0,this);
    ErrorUnlessOpcodeEnabled(this,&local_11c0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)35>::ExprMixin
              ((ExprMixin<(wabt::ExprType)35> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case RefNull:
    Consume((Token *)&type,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&type);
    local_1174 = (Enum)ParseRefKind(this,&local_1170);
    bVar2 = Failed((Result)local_1174);
    uVar1 = loc.field_1._8_8_;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    pEVar6 = (pointer)operator_new(0x48);
    local_117c = local_1170;
    RefTypeExpr<(wabt::ExprType)37>::RefTypeExpr
              ((RefTypeExpr<(wabt::ExprType)37> *)pEVar6,local_1170,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Rethrow:
    Consume(&local_1268,this);
    ErrorUnlessOpcodeEnabled(this,&local_1268);
    token_3.field_2.literal_.text._M_str = (char *)local_40;
    loc_25.filename._M_str = (char *)loc.filename._M_len;
    loc_25.filename._M_len = (size_t)local_40;
    loc_25.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_25.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>
                      (this,loc_25,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCallIndirect:
    Consume((Token *)&expr_2,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_2);
    std::make_unique<wabt::ReturnCallIndirectExpr,wabt::Location&>((Location *)local_4c8);
    pRVar9 = std::
             unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             ::operator->((unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                           *)local_4c8);
    Var::Var(&local_510,0,(Location *)local_40);
    ParseVarOpt(this,&pRVar9->table,&local_510);
    Var::~Var(&local_510);
    pRVar9 = std::
             unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             ::operator->((unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                           *)local_4c8);
    local_514 = (Enum)ParseTypeUseOpt(this,&pRVar9->decl);
    bVar2 = Failed((Result)local_514);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pRVar9 = std::
               unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
               ::operator->((unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                             *)local_4c8);
      local_518 = (Enum)ParseUnboundFuncSignature(this,&(pRVar9->decl).sig);
      bVar2 = Failed((Result)local_518);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   (unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                    *)local_4c8);
        local_160 = 2;
      }
    }
    std::
    unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>::
    ~unique_ptr((unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                 *)local_4c8);
    goto joined_r0x0018d427;
  case ReturnCall:
    Consume(&local_458,this);
    ErrorUnlessOpcodeEnabled(this,&local_458);
    loc_03.filename._M_str = (char *)loc.filename._M_len;
    loc_03.filename._M_len = (size_t)local_40;
    loc_03.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_03.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>
                      (this,loc_03,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Return:
    Consume(&local_2d8,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)39>::ExprMixin
              ((ExprMixin<(wabt::ExprType)39> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Select:
    Consume((Token *)&result.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,this);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
    bVar2 = Features::reference_types_enabled(&this->options_->features);
    if ((bVar2) && (bVar2 = PeekMatchLpar(this,Result), bVar2)) {
      local_15c = (Enum)ParseResultList(this,(TypeVector *)local_158,
                                        (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)0x0);
      bVar2 = Failed((Result)local_15c);
      if (!bVar2) goto LAB_0018bd45;
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
LAB_0018bd45:
      uVar1 = loc.field_1._8_8_;
      this_00 = (SelectExpr *)operator_new(0x58);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_178,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
      SelectExpr::SelectExpr(this_00,&local_178,(Location *)local_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_00)
      ;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_178);
      local_160 = 2;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
    goto joined_r0x0018d427;
  case SimdLaneOp:
    Consume((Token *)&lane_idx,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&lane_idx);
    uStack_1758 = 0;
    local_1780 = (char *)local_40;
    local_1778 = loc.filename._M_len;
    local_1770 = loc.filename._M_str;
    local_1768.offset = (size_t)loc.field_1.field_1.offset;
    loc_32.filename._M_str = (char *)loc.filename._M_len;
    loc_32.filename._M_len = (size_t)local_40;
    loc_32.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_32.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1784 = (Enum)ParseSimdLane(this,loc_32,&stack0xffffffffffffe8a8);
    local_175c = local_1784;
    bVar2 = Failed((Result)local_1784);
    uVar1 = loc.field_1._8_8_;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    this_05 = (SimdLaneOpExpr *)operator_new(0x48);
    local_1788 = (Enum)Token::opcode((Token *)&lane_idx);
    SimdLaneOpExpr::SimdLaneOpExpr(this_05,(Opcode)local_1788,uStack_1758,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_05);
    break;
  case SimdLoadLane:
    local_17b0 = (char *)local_40;
    sStack_17a8 = loc.filename._M_len;
    local_17a0 = loc.filename._M_str;
    aStack_1798.offset = (size_t)loc.field_1.field_1.offset;
    Consume(&local_17f0,this);
    loc_33.filename._M_str = (char *)sStack_17a8;
    loc_33.filename._M_len = (size_t)local_17b0;
    loc_33.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_17a0;
    loc_33.field_1._8_8_ = aStack_1798.offset;
    token_21.loc.filename._M_str = local_17f0.loc.filename._M_str;
    token_21.loc.filename._M_len = local_17f0.loc.filename._M_len;
    token_21.loc.field_1.field_1.offset = local_17f0.loc.field_1.field_1.offset;
    token_21.loc.field_1._8_8_ = local_17f0.loc.field_1._8_8_;
    token_21.token_type_ = local_17f0.token_type_;
    token_21._36_4_ = local_17f0._36_4_;
    token_21.field_2.text_._M_len = local_17f0.field_2.text_._M_len;
    token_21.field_2.text_._M_str = local_17f0.field_2.text_._M_str;
    token_21.field_2.literal_.text._M_str = local_17f0.field_2.literal_.text._M_str;
    local_178c = (Enum)ParseSIMDLoadStoreInstr<wabt::SimdLoadLaneExpr>
                                 (this,loc_33,token_21,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_178c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdStoreLane:
    Consume((Token *)&token_12.field_2.literal_.text._M_str,this);
    loc_34.filename._M_str = (char *)loc.filename._M_len;
    loc_34.filename._M_len = (size_t)local_40;
    loc_34.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_34.field_1._8_8_ = loc.field_1.field_1.offset;
    token_22.loc.filename._M_str = (char *)uStack_1850;
    token_22.loc.filename._M_len = (size_t)token_12.field_2.literal_.text._M_str;
    token_22.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1848;
    token_22.loc.field_1._8_8_ = uStack_1840;
    token_22._32_8_ = local_1838;
    token_22.field_2.text_._M_len = uStack_1830;
    token_22.field_2.text_._M_str = (char *)local_1828;
    token_22.field_2.literal_.text._M_str = (char *)uStack_1820;
    RVar4 = ParseSIMDLoadStoreInstr<wabt::SimdStoreLaneExpr>
                      (this,loc_34,token_22,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdShuffleOp:
    Consume((Token *)(values.v + 8),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)(values.v + 8));
    for (loc_1.field_1._12_4_ = 0; uVar1 = loc.field_1._8_8_, (int)loc_1.field_1._12_4_ < 0x10;
        loc_1.field_1._12_4_ = loc_1.field_1._12_4_ + 1) {
      GetLocation((Location *)&lane_idx_1,this);
      loc_35.filename._M_str = (char *)loc_1.filename._M_len;
      loc_35.filename._M_len = lane_idx_1;
      loc_35.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           loc_1.filename._M_str;
      loc_35.field_1._8_8_ = loc_1.field_1.field_1.offset;
      RVar4 = ParseSimdLane(this,loc_35,&stack0xffffffffffffe728);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      v128::set_u8((v128 *)auStack_18a8,loc_1.field_1._12_4_,(uint8_t)uStack_18d8);
    }
    this_06 = (SimdShuffleOpExpr *)operator_new(0x50);
    OVar5 = Token::opcode((Token *)(values.v + 8));
    val.v[8] = values.v[0];
    val.v[9] = values.v[1];
    val.v[10] = values.v[2];
    val.v[0xb] = values.v[3];
    val.v[0xc] = values.v[4];
    val.v[0xd] = values.v[5];
    val.v[0xe] = values.v[6];
    val.v[0xf] = values.v[7];
    val.v[0] = auStack_18a8[0];
    val.v[1] = auStack_18a8[1];
    val.v[2] = auStack_18a8[2];
    val.v[3] = auStack_18a8[3];
    val.v[4] = (uint8_t)lane;
    val.v[5] = lane._1_1_;
    val.v[6] = lane._2_1_;
    val.v[7] = lane._3_1_;
    SimdShuffleOpExpr::SimdShuffleOpExpr(this_06,OVar5,val,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_06);
    break;
  case Store:
    Consume((Token *)(const_.nan_ + 2),this);
    loc_10.filename._M_str = (char *)loc.filename._M_len;
    loc_10.filename._M_len = (size_t)local_40;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_10.field_1._8_8_ = loc.field_1.field_1.offset;
    token_14.loc.filename._M_str = (char *)uStack_7e8;
    token_14.loc.filename._M_len._0_4_ = const_.nan_[2];
    token_14.loc.filename._M_len._4_4_ = const_.nan_[3];
    token_14.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_7e0;
    token_14.loc.field_1._8_8_ = uStack_7d8;
    token_14._32_8_ = local_7d0;
    token_14.field_2.text_._M_len = uStack_7c8;
    token_14.field_2.text_._M_str = (char *)local_7c0;
    token_14.field_2.literal_.text._M_str = (char *)uStack_7b8;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)49>>
                      (this,loc_10,token_14,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableCopy:
    Consume((Token *)((long)&dst.field_2 + 0x18),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)((long)&dst.field_2 + 0x18));
    Var::Var((Var *)((long)&src.field_2 + 0x18),0,(Location *)local_40);
    Var::Var((Var *)local_ca0,0,(Location *)local_40);
    bVar2 = Features::reference_types_enabled(&this->options_->features);
    if (bVar2) {
      Var::Var(&local_ce8,(Var *)((long)&src.field_2 + 0x18));
      ParseVarOpt(this,(Var *)((long)&src.field_2 + 0x18),&local_ce8);
      Var::~Var(&local_ce8);
      Var::Var(&local_d30,(Var *)local_ca0);
      ParseVarOpt(this,(Var *)local_ca0,&local_d30);
      Var::~Var(&local_d30);
    }
    uVar1 = loc.field_1._8_8_;
    this_03 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr
              (this_03,(Var *)((long)&src.field_2 + 0x18),(Var *)local_ca0,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_03);
    local_160 = 2;
    Var::~Var((Var *)local_ca0);
    Var::~Var((Var *)((long)&src.field_2 + 0x18));
    break;
  case TableFill:
    Consume(&local_1098,this);
    ErrorUnlessOpcodeEnabled(this,&local_1098);
    local_10c0 = (char *)local_40;
    local_10b8 = loc.filename._M_len;
    local_10b0 = loc.filename._M_str;
    local_10a8.offset = (size_t)loc.field_1.field_1.offset;
    loc_22.filename._M_str = (char *)loc.filename._M_len;
    loc_22.filename._M_len = (size_t)local_40;
    loc_22.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_22.field_1._8_8_ = loc.field_1.field_1.offset;
    local_109c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)57>>
                                 (this,loc_22,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_109c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGet:
    Consume(&local_ef8,this);
    ErrorUnlessOpcodeEnabled(this,&local_ef8);
    local_f20 = (char *)local_40;
    local_f18 = loc.filename._M_len;
    local_f10 = loc.filename._M_str;
    local_f08.offset = (size_t)loc.field_1.field_1.offset;
    loc_18.filename._M_str = (char *)loc.filename._M_len;
    loc_18.filename._M_len = (size_t)local_40;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_18.field_1._8_8_ = loc.field_1.field_1.offset;
    local_efc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)53>>
                                (this,loc_18,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_efc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGrow:
    Consume(&local_fc8,this);
    ErrorUnlessOpcodeEnabled(this,&local_fc8);
    local_ff0 = (char *)local_40;
    local_fe8 = loc.filename._M_len;
    local_fe0 = loc.filename._M_str;
    local_fd8.offset = (size_t)loc.field_1.field_1.offset;
    loc_20.filename._M_str = (char *)loc.filename._M_len;
    loc_20.filename._M_len = (size_t)local_40;
    loc_20.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_20.field_1._8_8_ = loc.field_1.field_1.offset;
    local_fcc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>
                                (this,loc_20,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_fcc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableInit:
    Consume((Token *)((long)&segment_index.field_2 + 0x18),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)((long)&segment_index.field_2 + 0x18));
    Var::Var((Var *)local_e20,0,(Location *)local_40);
    table_index.field_2._28_4_ = ParseVar(this,(Var *)local_e20);
    bVar2 = Failed((Result)table_index.field_2._28_4_);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      Var::Var((Var *)local_e70,0,(Location *)local_40);
      Var::Var(&local_eb8,(Var *)local_e70);
      bVar2 = ParseVarOpt(this,(Var *)local_e70,&local_eb8);
      Var::~Var(&local_eb8);
      if (bVar2) {
        std::swap<wabt::Var>((Var *)local_e20,(Var *)local_e70);
      }
      uVar1 = loc.field_1._8_8_;
      this_04 = (TableInitExpr *)operator_new(0xd0);
      TableInitExpr::TableInitExpr(this_04,(Var *)local_e20,(Var *)local_e70,(Location *)local_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_04)
      ;
      local_160 = 2;
      Var::~Var((Var *)local_e70);
    }
    Var::~Var((Var *)local_e20);
joined_r0x0018d427:
    if (local_160 == 1) {
      return (Result)this_local._4_4_;
    }
    break;
  case TableSet:
    Consume(&local_f60,this);
    ErrorUnlessOpcodeEnabled(this,&local_f60);
    local_f88 = (char *)local_40;
    local_f80 = loc.filename._M_len;
    local_f78 = loc.filename._M_str;
    local_f70.offset = (size_t)loc.field_1.field_1.offset;
    loc_19.filename._M_str = (char *)loc.filename._M_len;
    loc_19.filename._M_len = (size_t)local_40;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_19.field_1._8_8_ = loc.field_1.field_1.offset;
    local_f64 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)56>>
                                (this,loc_19,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_f64);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableSize:
    Consume(&local_1030,this);
    ErrorUnlessOpcodeEnabled(this,&local_1030);
    local_1058 = (char *)local_40;
    local_1050 = loc.filename._M_len;
    local_1048 = loc.filename._M_str;
    local_1040.offset = (size_t)loc.field_1.field_1.offset;
    loc_21.filename._M_str = (char *)loc.filename._M_len;
    loc_21.filename._M_len = (size_t)local_40;
    loc_21.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_21.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1034 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)55>>
                                 (this,loc_21,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_1034);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Ternary:
    Consume((Token *)local_1708,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1708);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    token_11.field_2._20_4_ = Token::opcode((Token *)local_1708);
    OpcodeExpr<(wabt::ExprType)58>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)58> *)pEVar6,(Opcode)token_11.field_2._20_4_,
               (Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Throw:
    Consume(&local_1200,this);
    ErrorUnlessOpcodeEnabled(this,&local_1200);
    local_1228 = (char *)local_40;
    local_1220 = loc.filename._M_len;
    local_1218 = loc.filename._M_str;
    local_1210.offset = (size_t)loc.field_1.field_1.offset;
    loc_24.filename._M_str = (char *)loc.filename._M_len;
    loc_24.filename._M_len = (size_t)local_40;
    loc_24.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename._M_str
    ;
    loc_24.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1204 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)59>>
                                 (this,loc_24,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_1204);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Unary:
    Consume((Token *)local_888,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_888);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    token_1.field_2._20_4_ = Token::opcode((Token *)local_888);
    OpcodeExpr<(wabt::ExprType)61>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)61> *)pEVar6,(Opcode)token_1.field_2._20_4_,
               (Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Last_Opcode:
    Consume(&local_80,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)62>::ExprMixin
              ((ExprMixin<(wabt::ExprType)62> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          PeekMatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseResultList(&result, nullptr));
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = std::make_unique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = std::make_unique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::CallRef: {
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new CallRefExpr(loc));
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<ReturnCallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(ParseLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(ParseLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryBinaryExpr<MemoryCopyExpr>(loc, out_expr));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryExpr<MemoryFillExpr>(loc, out_expr));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemorySizeExpr>(loc, out_expr));
      break;

    case TokenType::MemoryGrow:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemoryGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull: {
      ErrorUnlessOpcodeEnabled(Consume());
      Type type;
      CHECK_RESULT(ParseRefKind(&type));
      out_expr->reset(new RefNullExpr(type, loc));
      break;
    }

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RethrowExpr>(loc, out_expr));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicFence: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint32_t consistency_model = 0x0;
      out_expr->reset(new AtomicFenceExpr(consistency_model, loc));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParseLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);

      uint64_t lane_idx = 0;
      Result result = ParseSimdLane(loc, &lane_idx);

      if (Failed(result)) {
        return Result::Error;
      }

      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdLoadLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdLoadLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdStoreLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdStoreLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      v128 values;
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();
        uint64_t lane_idx;
        Result result = ParseSimdLane(loc, &lane_idx);
        if (Failed(result)) {
          return Result::Error;
        }

        values.set_u8(lane, static_cast<uint8_t>(lane_idx));
      }

      out_expr->reset(new SimdShuffleOpExpr(token.opcode(), values, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}